

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O3

void __thiscall ki::protocol::net::ClientSession::on_session_offer(ClientSession *this)

{
  _func_int **pp_Var1;
  uint16_t uVar2;
  long lVar3;
  undefined8 uVar4;
  _func_int *p_Var5;
  int timestamp;
  SessionAccept accept;
  SessionOffer offer;
  SessionOffer local_50;
  SessionOffer local_38;
  
  control::SessionOffer::SessionOffer(&local_38,0,0,0);
  p_Var5 = this->_vptr_ClientSession[-3];
  control::SessionOffer::SessionOffer(&local_50,0,0,0);
  control::SessionOffer::read_from(&local_50,(istream *)(&this->field_0x40 + (long)p_Var5));
  local_38.m_milliseconds = local_50.m_milliseconds;
  local_38.m_session_id = local_50.m_session_id;
  local_38._10_2_ = local_50._10_2_;
  local_38.m_timestamp = local_50.m_timestamp;
  lVar3 = std::chrono::_V2::steady_clock::now();
  if (lVar3 - *(long *)(&this->field_0x18 + (long)this->_vptr_ClientSession[-3]) < 4000000000) {
    lVar3 = std::chrono::_V2::system_clock::now();
    timestamp = (int)(SUB168(SEXT816(lVar3) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                (SUB164(SEXT816(lVar3) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f);
    uVar2 = control::SessionOffer::get_session_id(&local_38);
    pp_Var1 = this->_vptr_ClientSession;
    *(uint16_t *)(&this->field_0x8 + (long)pp_Var1[-3]) = uVar2;
    control::SessionAccept::SessionAccept
              ((SessionAccept *)&local_50,*(uint16_t *)(&this->field_0x8 + (long)pp_Var1[-3]),
               timestamp,
               timestamp * -1000 +
               ((int)(SUB168(SEXT816(lVar3) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
               (SUB164(SEXT816(lVar3) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f)));
    Session::send_packet
              ((Session *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]),
               true,'\x05',&local_50.super_Serializable);
    (&this->field_0xa)[(long)this->_vptr_ClientSession[-3]] = 1;
    uVar4 = std::chrono::_V2::steady_clock::now();
    pp_Var1 = this->_vptr_ClientSession;
    *(undefined8 *)(&this->field_0x20 + (long)pp_Var1[-3]) = uVar4;
    *(undefined8 *)(&this->field_0x28 + (long)pp_Var1[-3]) =
         *(undefined8 *)(&this->field_0x20 + (long)pp_Var1[-3]);
    (*pp_Var1[3])(this);
  }
  else {
    p_Var5 = (_func_int *)((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-3]);
    (**(code **)(*(long *)p_Var5 + 0x38))(p_Var5,7);
  }
  return;
}

Assistant:

void ClientSession::on_session_offer()
	{
		// Read the payload data into a structure
		control::SessionOffer offer;
		try
		{
			offer = read_data<control::SessionOffer>();
		}
		catch (parse_error &e)
		{
			// The SESSION_OFFER wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Should this session have already timed out?
		if (std::chrono::duration_cast<std::chrono::seconds>(
				std::chrono::steady_clock::now() - m_connection_time
			).count() > KI_CONNECTION_TIMEOUT)
		{
			close(SessionCloseErrorCode::SESSION_OFFER_TIMED_OUT);
			return;
		}

		// Work out the current timestamp and how many milliseconds 
		// have elapsed in the current second. 
		auto now = std::chrono::system_clock::now();
		const auto timestamp = std::chrono::duration_cast<std::chrono::seconds>(
			now.time_since_epoch()
		).count();
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			now.time_since_epoch()
		).count() - (timestamp * 1000);

		// Accept the session
		m_id = offer.get_session_id();
		control::SessionAccept accept(m_id, timestamp, milliseconds);
		send_packet(true, (uint8_t)control::Opcode::SESSION_ACCEPT, accept);

		// The session is successfully established
		m_established = true;
		m_establish_time = std::chrono::steady_clock::now();
		m_last_received_heartbeat_time = m_establish_time;
		on_established();
	}